

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstring.cpp
# Opt level: O2

void __thiscall FString::FString(FString *this,char *head,FString *tail)

{
  char *pcVar1;
  size_t __n;
  ulong __n_00;
  
  __n = strlen(head);
  AllocBuffer(this,*(uint *)(tail->Chars + -0xc) + __n);
  pcVar1 = this->Chars;
  memcpy(pcVar1,head,__n);
  pcVar1[__n] = '\0';
  pcVar1 = this->Chars;
  __n_00 = (ulong)*(uint *)(tail->Chars + -0xc);
  memcpy(pcVar1 + __n,tail->Chars,__n_00);
  (pcVar1 + __n)[__n_00] = '\0';
  return;
}

Assistant:

FString::FString (const char *head, const FString &tail)
{
	size_t len1 = strlen (head);
	size_t len2 = tail.Len();
	AllocBuffer (len1 + len2);
	StrCopy (Chars, head, len1);
	StrCopy (Chars + len1, tail);
}